

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.hpp
# Opt level: O1

ostream * OpenMD::operator<<(ostream *o,Vector<double,_3U> *v)

{
  uint i;
  long lVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(o,"[ ",2);
  lVar1 = 0;
  do {
    std::ostream::_M_insert<double>(v->data_[lVar1]);
    if (lVar1 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>(o,", ",2);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  std::__ostream_insert<char,std::char_traits<char>>(o," ]",2);
  return o;
}

Assistant:

std::ostream& operator<<(std::ostream& o, const Vector<Real, Dim>& v) {
    o << "[ ";

    for (unsigned int i = 0; i < Dim; i++) {
      o << v[i];

      if (i != Dim - 1) { o << ", "; }
    }

    o << " ]";
    return o;
  }